

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

GLuint gl4cts::SparseBufferTestUtilities::createProgram
                 (Functions *gl,char **fs_body_parts,uint n_fs_body_parts,char **vs_body_parts,
                 uint n_vs_body_parts,char **attribute_names,uint *attribute_locations,
                 uint n_attribute_properties,GLchar **tf_varyings,uint n_tf_varyings,
                 GLenum tf_varying_mode)

{
  char **ppcVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLenum GVar4;
  bool bVar5;
  ulong uVar6;
  bool bVar7;
  GLint link_status;
  char temp [1024];
  GLuint local_460;
  GLint local_45c;
  char **local_458;
  char **local_450;
  GLint local_444;
  char **local_440;
  GLchar local_438 [1032];
  
  local_45c = 0;
  local_460 = 0;
  local_444 = 0;
  GVar2 = 0;
  local_458 = fs_body_parts;
  local_450 = vs_body_parts;
  if (n_fs_body_parts != 0) {
    GVar2 = (*gl->createShader)(0x8b30);
  }
  GVar3 = (*gl->createProgram)();
  if (n_vs_body_parts != 0) {
    local_460 = (*gl->createShader)(0x8b31);
  }
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glCreateProgram() / glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd8);
  if (n_fs_body_parts != 0) {
    (*gl->attachShader)(GVar3,GVar2);
  }
  if (n_vs_body_parts != 0) {
    (*gl->attachShader)(GVar3,local_460);
  }
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glAttachShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xe4);
  if (n_fs_body_parts != 0) {
    (*gl->shaderSource)(GVar2,n_fs_body_parts,local_458,(GLint *)0x0);
  }
  local_458 = (char **)CONCAT44(local_458._4_4_,GVar3);
  local_440 = attribute_names;
  if (n_vs_body_parts != 0) {
    (*gl->shaderSource)(local_460,n_vs_body_parts,local_450,(GLint *)0x0);
  }
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glShaderSource() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xf0);
  local_450 = (char **)CONCAT44(local_450._4_4_,GVar2);
  bVar7 = true;
  do {
    bVar5 = bVar7;
    if (GVar2 != 0) {
      (*gl->compileShader)(GVar2);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0xfb);
      (*gl->getShaderiv)(GVar2,0x8b81,&local_45c);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glGetShaderiv() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0xff);
      bVar7 = false;
      (*gl->getShaderInfoLog)(GVar2,0x400,(GLsizei *)0x0,local_438);
      if (local_45c != 1) {
        GVar2 = (GLuint)local_458;
        goto LAB_00a42c87;
      }
    }
    ppcVar1 = local_440;
    GVar2 = local_460;
    bVar7 = false;
  } while (bVar5);
  GVar2 = (GLuint)local_458;
  if (n_attribute_properties != 0) {
    uVar6 = 0;
    do {
      (*gl->bindAttribLocation)(GVar2,attribute_locations[uVar6],ppcVar1[uVar6]);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glBindAttribLocation() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x111);
      uVar6 = uVar6 + 1;
    } while (n_attribute_properties != uVar6);
  }
  if (n_tf_varyings != 0) {
    (*gl->transformFeedbackVaryings)(GVar2,n_tf_varyings,tf_varyings,tf_varying_mode);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glTransformFeedbackVaryings() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x118);
  }
  (*gl->linkProgram)(GVar2);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glLinkProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x11d);
  (*gl->getProgramiv)(GVar2,0x8b82,&local_444);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glGetProgramiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x121);
  bVar7 = local_444 == 1;
LAB_00a42c87:
  if ((GLuint)local_450 != 0) {
    (*gl->deleteShader)((GLuint)local_450);
  }
  if (local_460 != 0) {
    (*gl->deleteShader)(local_460);
  }
  if (GVar2 != 0 && !bVar7) {
    (*gl->deleteProgram)(GVar2);
    GVar2 = 0;
  }
  return GVar2;
}

Assistant:

glw::GLuint SparseBufferTestUtilities::createProgram(const glw::Functions& gl, const char** fs_body_parts,
													 unsigned int n_fs_body_parts, const char** vs_body_parts,
													 unsigned int n_vs_body_parts, const char** attribute_names,
													 const unsigned int*	   attribute_locations,
													 unsigned int			   n_attribute_properties,
													 const glw::GLchar* const* tf_varyings, unsigned int n_tf_varyings,
													 glw::GLenum tf_varying_mode)
{
	glw::GLint  compile_status = GL_FALSE;
	glw::GLuint fs_id		   = 0;
	glw::GLint  link_status	= GL_FALSE;
	glw::GLuint po_id		   = 0;
	bool		result		   = true;
	glw::GLuint vs_id		   = 0;

	if (n_fs_body_parts > 0)
	{
		fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	}

	po_id = gl.createProgram();

	if (n_vs_body_parts > 0)
	{
		vs_id = gl.createShader(GL_VERTEX_SHADER);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() / glCreateShader() call(s) failed.");

	if (n_fs_body_parts > 0)
	{
		gl.attachShader(po_id, fs_id);
	}

	if (n_vs_body_parts > 0)
	{
		gl.attachShader(po_id, vs_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	if (n_fs_body_parts > 0)
	{
		gl.shaderSource(fs_id, n_fs_body_parts, fs_body_parts, NULL); /* length */
	}

	if (n_vs_body_parts > 0)
	{
		gl.shaderSource(vs_id, n_vs_body_parts, vs_body_parts, NULL); /* length */
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call(s) failed.");

	const glw::GLuint  so_ids[] = { fs_id, vs_id };
	const unsigned int n_so_ids = sizeof(so_ids) / sizeof(so_ids[0]);

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		if (so_ids[n_so_id] != 0)
		{
			gl.compileShader(so_ids[n_so_id]);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

			gl.getShaderiv(so_ids[n_so_id], GL_COMPILE_STATUS, &compile_status);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed");

			char temp[1024];
			gl.getShaderInfoLog(so_ids[n_so_id], 1024, NULL, temp);

			if (GL_TRUE != compile_status)
			{
				result = false;

				goto end;
			}
		} /* if (so_ids[n_so_id] != 0) */
	}	 /* for (all shader object IDs) */

	for (unsigned int n_attribute = 0; n_attribute < n_attribute_properties; ++n_attribute)
	{
		gl.bindAttribLocation(po_id, attribute_locations[n_attribute], attribute_names[n_attribute]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindAttribLocation() call failed.");
	} /* for (all attributes to configure) */

	if (n_tf_varyings != 0)
	{
		gl.transformFeedbackVaryings(po_id, n_tf_varyings, tf_varyings, tf_varying_mode);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");
	} /* if (n_tf_varyings != 0) */

	gl.linkProgram(po_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(po_id, GL_LINK_STATUS, &link_status);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (GL_TRUE != link_status)
	{
		result = false;

		goto end;
	}

end:
	if (fs_id != 0)
	{
		gl.deleteShader(fs_id);

		fs_id = 0;
	}

	if (vs_id != 0)
	{
		gl.deleteShader(vs_id);

		vs_id = 0;
	}

	if (!result)
	{

		if (po_id != 0)
		{
			gl.deleteProgram(po_id);

			po_id = 0;
		}
	} /* if (!result) */

	return po_id;
}